

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_write_gnutar_header(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  wchar_t wVar2;
  int iVar3;
  archive_string_conv *paVar4;
  char *pcVar5;
  size_t sVar6;
  archive_string *paVar7;
  int *piVar8;
  char *pcVar9;
  archive_entry *paVar10;
  int64_t iVar11;
  archive_entry *in_RSI;
  archive_write *in_RDI;
  archive_entry *temp_1;
  size_t todo_1;
  char *pathname;
  archive_entry *temp;
  size_t todo;
  archive_string as;
  size_t path_length;
  char *p;
  archive_entry *entry_main;
  archive_string_conv *sconv;
  gnutar *gnutar;
  int tartype;
  int ret2;
  int ret;
  int r;
  char buff [512];
  archive_entry *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  mode_t in_stack_fffffffffffffd14;
  archive_entry *in_stack_fffffffffffffd18;
  archive_write *paVar12;
  archive_entry *in_stack_fffffffffffffd20;
  archive_write *in_stack_fffffffffffffd28;
  archive_string *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  archive_entry *in_stack_fffffffffffffd40;
  archive_write *in_stack_fffffffffffffd48;
  archive_write *in_stack_fffffffffffffd50;
  archive_string_conv *local_238;
  long *plVar13;
  int iVar14;
  int iVar15;
  int local_4;
  
  iVar15 = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
  iVar14 = 0;
  plVar13 = (long *)in_RDI->format_data;
  if (plVar13[10] == 0) {
    if ((int)plVar13[0xc] == 0) {
      paVar4 = archive_string_default_conversion_for_write((archive_conflict *)in_RDI);
      plVar13[0xb] = (long)paVar4;
      *(undefined4 *)(plVar13 + 0xc) = 1;
    }
    local_238 = (archive_string_conv *)plVar13[0xb];
  }
  else {
    local_238 = (archive_string_conv *)plVar13[10];
  }
  pcVar5 = archive_entry_hardlink(in_stack_fffffffffffffd08);
  if (((pcVar5 != (char *)0x0) ||
      (pcVar5 = archive_entry_symlink(in_stack_fffffffffffffd08), pcVar5 != (char *)0x0)) ||
     (mVar1 = archive_entry_filetype(in_RSI), mVar1 != 0x8000)) {
    archive_entry_set_size(in_RSI,0);
  }
  mVar1 = archive_entry_filetype(in_RSI);
  if (((mVar1 == 0x4000) &&
      (pcVar5 = archive_entry_pathname(in_stack_fffffffffffffd08), pcVar5 != (char *)0x0)) &&
     (sVar6 = strlen(pcVar5), pcVar5[sVar6 - 1] != '/')) {
    strlen(pcVar5);
    paVar7 = archive_string_ensure
                       ((archive_string *)in_stack_fffffffffffffd18,
                        CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    if (paVar7 == (archive_string *)0x0) {
      archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate ustar data");
      archive_string_free((archive_string *)0x18a5bb);
      return -0x1e;
    }
    archive_strncat(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                    (size_t)in_stack_fffffffffffffd20);
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char)((ulong)in_stack_fffffffffffffd08 >> 0x38));
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    archive_string_free((archive_string *)0x18a628);
  }
  wVar2 = _archive_entry_pathname_l
                    (in_stack_fffffffffffffd20,(char **)in_stack_fffffffffffffd18,
                     (size_t *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (archive_string_conv *)in_stack_fffffffffffffd08);
  if (wVar2 != L'\0') {
    piVar8 = __errno_location();
    if (*piVar8 == 0xc) {
      archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate memory for Pathame");
      return -0x1e;
    }
    pcVar5 = archive_entry_pathname(in_stack_fffffffffffffd08);
    pcVar9 = archive_string_conversion_charset_name(local_238);
    archive_set_error(&in_RDI->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar5,pcVar9);
    iVar14 = -0x14;
  }
  wVar2 = _archive_entry_uname_l
                    (in_stack_fffffffffffffd20,(char **)in_stack_fffffffffffffd18,
                     (size_t *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (archive_string_conv *)in_stack_fffffffffffffd08);
  if (wVar2 != L'\0') {
    piVar8 = __errno_location();
    if (*piVar8 == 0xc) {
      archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate memory for Uname");
      return -0x1e;
    }
    in_stack_fffffffffffffd48 = in_RDI;
    in_stack_fffffffffffffd50 = (archive_write *)archive_entry_uname(in_stack_fffffffffffffd08);
    pcVar5 = archive_string_conversion_charset_name(local_238);
    archive_set_error(&in_stack_fffffffffffffd48->archive,0x54,"Can\'t translate uname \'%s\' to %s"
                      ,in_stack_fffffffffffffd50,pcVar5);
    iVar14 = -0x14;
  }
  wVar2 = _archive_entry_gname_l
                    (in_stack_fffffffffffffd20,(char **)in_stack_fffffffffffffd18,
                     (size_t *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (archive_string_conv *)in_stack_fffffffffffffd08);
  if (wVar2 != L'\0') {
    piVar8 = __errno_location();
    if (*piVar8 == 0xc) {
      archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate memory for Gname");
      return -0x1e;
    }
    paVar12 = in_RDI;
    in_stack_fffffffffffffd40 = (archive_entry *)archive_entry_gname(in_stack_fffffffffffffd08);
    pcVar5 = archive_string_conversion_charset_name(local_238);
    archive_set_error(&paVar12->archive,0x54,"Can\'t translate gname \'%s\' to %s",
                      in_stack_fffffffffffffd40,pcVar5);
    iVar15 = (int)((ulong)paVar12 >> 0x20);
    iVar14 = -0x14;
  }
  wVar2 = _archive_entry_hardlink_l
                    (in_stack_fffffffffffffd18,
                     (char **)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     (size_t *)in_stack_fffffffffffffd08,(archive_string_conv *)0x18a8cd);
  if (wVar2 != L'\0') {
    piVar8 = __errno_location();
    if (*piVar8 == 0xc) {
      archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate memory for Linkname");
      return -0x1e;
    }
    in_stack_fffffffffffffd28 = in_RDI;
    pcVar5 = archive_entry_hardlink(in_stack_fffffffffffffd08);
    pcVar9 = archive_string_conversion_charset_name(local_238);
    archive_set_error(&in_stack_fffffffffffffd28->archive,0x54,
                      "Can\'t translate linkname \'%s\' to %s",pcVar5,pcVar9);
    iVar14 = -0x14;
  }
  if ((plVar13[3] == 0) &&
     (wVar2 = _archive_entry_symlink_l
                        (in_stack_fffffffffffffd18,
                         (char **)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                         (size_t *)in_stack_fffffffffffffd08,(archive_string_conv *)0x18a9ae),
     wVar2 != L'\0')) {
    piVar8 = __errno_location();
    if (*piVar8 == 0xc) {
      archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate memory for Linkname");
      return -0x1e;
    }
    paVar12 = in_RDI;
    in_stack_fffffffffffffd20 = (archive_entry *)archive_entry_hardlink(in_stack_fffffffffffffd08);
    pcVar5 = archive_string_conversion_charset_name(local_238);
    archive_set_error(&paVar12->archive,0x54,"Can\'t translate linkname \'%s\' to %s",
                      in_stack_fffffffffffffd20,pcVar5);
    iVar14 = -0x14;
  }
  if (100 < (ulong)plVar13[3]) {
    paVar10 = archive_entry_new2((archive_conflict *)in_stack_fffffffffffffd08);
    archive_entry_set_uname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    archive_entry_set_gname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    archive_entry_set_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    archive_entry_set_size(paVar10,plVar13[3] + 1);
    iVar3 = archive_format_gnutar_header
                      (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                       in_stack_fffffffffffffd40,iVar15);
    if (iVar3 < -0x14) {
      return iVar3;
    }
    iVar3 = __archive_write_output
                      ((archive_write *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd08,0x18ab38);
    if (iVar3 < -0x14) {
      return iVar3;
    }
    archive_entry_free((archive_entry *)0x18ab5b);
    iVar3 = __archive_write_output
                      ((archive_write *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd08,0x18ab7c);
    if (iVar3 < -0x14) {
      return iVar3;
    }
    iVar3 = __archive_write_nulls(in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    if (iVar3 < -0x14) {
      return iVar3;
    }
  }
  if (100 < (ulong)plVar13[5]) {
    paVar10 = archive_entry_new2((archive_conflict *)in_stack_fffffffffffffd08);
    archive_entry_set_uname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    archive_entry_set_gname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    archive_entry_set_pathname
              ((archive_entry *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
               (char *)in_stack_fffffffffffffd08);
    archive_entry_set_size(paVar10,plVar13[5] + 1);
    iVar3 = archive_format_gnutar_header
                      (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                       in_stack_fffffffffffffd40,iVar15);
    if (iVar3 < -0x14) {
      return iVar3;
    }
    iVar3 = __archive_write_output
                      ((archive_write *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd08,0x18acad);
    if (iVar3 < -0x14) {
      return iVar3;
    }
    archive_entry_free((archive_entry *)0x18accd);
    iVar3 = __archive_write_output
                      ((archive_write *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                       in_stack_fffffffffffffd08,0x18ace4);
    if (iVar3 < -0x14) {
      return iVar3;
    }
    iVar3 = __archive_write_nulls(in_stack_fffffffffffffd28,(size_t)in_stack_fffffffffffffd20);
    if (iVar3 < -0x14) {
      return iVar3;
    }
  }
  pcVar5 = archive_entry_hardlink(in_stack_fffffffffffffd08);
  if (((((pcVar5 == (char *)0x0) &&
        (in_stack_fffffffffffffd14 = archive_entry_filetype(in_RSI),
        in_stack_fffffffffffffd14 != 0x1000)) && (in_stack_fffffffffffffd14 != 0x2000)) &&
      ((in_stack_fffffffffffffd14 != 0x4000 && (in_stack_fffffffffffffd14 != 0x6000)))) &&
     ((in_stack_fffffffffffffd14 != 0x8000 && (in_stack_fffffffffffffd14 != 0xa000)))) {
    if (in_stack_fffffffffffffd14 == 0xc000) {
      archive_set_error(&in_RDI->archive,0x54,"tar format cannot archive socket");
      local_4 = -0x19;
    }
    else {
      mVar1 = archive_entry_mode(in_RSI);
      archive_set_error(&in_RDI->archive,0x54,"tar format cannot archive this (mode=0%lo)",
                        (ulong)mVar1);
      local_4 = -0x19;
    }
  }
  else {
    local_4 = archive_format_gnutar_header
                        (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                         in_stack_fffffffffffffd40,iVar15);
    if (-0x15 < local_4) {
      iVar15 = local_4;
      if (iVar14 < local_4) {
        iVar15 = iVar14;
      }
      local_4 = __archive_write_output
                          ((archive_write *)
                           CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                           in_stack_fffffffffffffd08,0x18af00);
      if (-0x15 < local_4) {
        if (local_4 < iVar15) {
          iVar15 = local_4;
        }
        iVar11 = archive_entry_size(in_RSI);
        *plVar13 = iVar11;
        plVar13[1] = -*plVar13 & 0x1ff;
        local_4 = iVar15;
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_write_gnutar_header(struct archive_write *a,
     struct archive_entry *entry)
{
	char buff[512];
	int r, ret, ret2 = ARCHIVE_OK;
	int tartype;
	struct gnutar *gnutar;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;

	gnutar = (struct gnutar *)a->format_data;

	/* Setup default string conversion. */
	if (gnutar->opt_sconv == NULL) {
		if (!gnutar->init_default_conversion) {
			gnutar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			gnutar->init_default_conversion = 1;
		}
		sconv = gnutar->sconv_default;
	} else
		sconv = gnutar->opt_sconv;

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	r = archive_entry_pathname_l(entry, &(gnutar->pathname),
	    &(gnutar->pathname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathame");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_uname_l(entry, &(gnutar->uname),
	    &(gnutar->uname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate uname '%s' to %s",
		    archive_entry_uname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_gname_l(entry, &(gnutar->gname),
	    &(gnutar->gname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate gname '%s' to %s",
		    archive_entry_gname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}

	/* If linkname is longer than 100 chars we need to add a 'K' header. */
	r = archive_entry_hardlink_l(entry, &(gnutar->linkname),
	    &(gnutar->linkname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_hardlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	if (gnutar->linkname_length == 0) {
		r = archive_entry_symlink_l(entry, &(gnutar->linkname),
		    &(gnutar->linkname_length), sconv);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				ret = ARCHIVE_FATAL;
				goto exit_write_header;
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate linkname '%s' to %s",
			    archive_entry_hardlink(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
	}
	if (gnutar->linkname_length > GNUTAR_linkname_size) {
		size_t todo = gnutar->linkname_length;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, gnutar->linkname_length + 1);
		ret = archive_format_gnutar_header(a, buff, temp, 'K');
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		archive_entry_free(temp);
		/* Write as many 512 bytes blocks as needed to write full name. */
		ret = __archive_write_output(a, gnutar->linkname, todo);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)todo));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	/* If pathname is longer than 100 chars we need to add an 'L' header. */
	if (gnutar->pathname_length > GNUTAR_name_size) {
		const char *pathname = gnutar->pathname;
		size_t todo = gnutar->pathname_length;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, gnutar->pathname_length + 1);
		ret = archive_format_gnutar_header(a, buff, temp, 'L');
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		archive_entry_free(temp);
		/* Write as many 512 bytes blocks as needed to write full name. */
		ret = __archive_write_output(a, pathname, todo);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)todo));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	if (archive_entry_hardlink(entry) != NULL) {
		tartype = '1';
	} else
		switch (archive_entry_filetype(entry)) {
		case AE_IFREG: tartype = '0' ; break;
		case AE_IFLNK: tartype = '2' ; break;
		case AE_IFCHR: tartype = '3' ; break;
		case AE_IFBLK: tartype = '4' ; break;
		case AE_IFDIR: tartype = '5' ; break;
		case AE_IFIFO: tartype = '6' ; break;
		case AE_IFSOCK:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive socket");
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		default:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive this (mode=0%lo)",
			    (unsigned long)archive_entry_mode(entry));
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		}

	ret = archive_format_gnutar_header(a, buff, entry, tartype);
	if (ret < ARCHIVE_WARN)
		goto exit_write_header;
	if (ret2 < ret)
		ret = ret2;
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		ret = ret2;
		goto exit_write_header;
	}
	if (ret2 < ret)
		ret = ret2;

	gnutar->entry_bytes_remaining = archive_entry_size(entry);
	gnutar->entry_padding = 0x1ff & (-(int64_t)gnutar->entry_bytes_remaining);
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}